

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::floatMargins
          (QTextDocumentLayoutPrivate *this,QFixed y,QTextLayoutStruct *layoutStruct,QFixed *left,
          QFixed *right)

{
  long lVar1;
  bool bVar2;
  QFixed lhs;
  Position PVar3;
  QTextFrameData *pQVar4;
  QTextFrame *this_00;
  qsizetype qVar5;
  QTextFrameData *pQVar6;
  QFixed *pQVar7;
  QList<QPointer<QTextFrame>_> *in_RCX;
  long in_RDX;
  QFixed in_ESI;
  int *in_R8;
  long in_FS_OFFSET;
  QTextFrameData *fd;
  int i;
  QTextFrameData *lfd;
  QFixed *in_stack_ffffffffffffff68;
  QList<QPointer<QTextFrame>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int local_64;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&(in_RCX->d).d = *(undefined4 *)(in_RDX + 8);
  *in_R8 = *(int *)(in_RDX + 0xc);
  pQVar4 = ::data((QTextFrame *)in_stack_ffffffffffffff70);
  local_64 = 0;
  while( true ) {
    this_00 = (QTextFrame *)(long)local_64;
    qVar5 = QList<QPointer<QTextFrame>_>::size(&pQVar4->floats);
    if (qVar5 <= (long)this_00) break;
    QList<QPointer<QTextFrame>_>::at(in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68)
    ;
    ::QPointer::operator_cast_to_QTextFrame_((QPointer<QTextFrame> *)0x80a290);
    pQVar6 = ::data((QTextFrame *)in_stack_ffffffffffffff70);
    if (((pQVar6->layoutDirty & 1U) == 0) &&
       (bVar2 = operator<=((QFixed)(pQVar6->position).y.val,in_ESI), bVar2)) {
      lhs = QFixed::operator+(in_stack_ffffffffffffff68,(int)in_stack_ffffffffffffff70);
      bVar2 = operator>(lhs,in_ESI);
      if (bVar2) {
        QList<QPointer<QTextFrame>_>::at
                  (in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
        QPointer<QTextFrame>::operator->((QPointer<QTextFrame> *)0x80a335);
        QTextFrame::frameFormat(this_00);
        PVar3 = QTextFrameFormat::position((QTextFrameFormat *)0x80a352);
        QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x80a363);
        if (PVar3 == FloatLeft) {
          in_stack_ffffffffffffff70 = in_RCX;
          QFixed::operator+(in_stack_ffffffffffffff68,(QFixed)(int)in_RCX);
          pQVar7 = qMax<QFixed>((QFixed *)this_00,
                                (QFixed *)CONCAT44(PVar3,in_stack_ffffffffffffff78));
          *(int *)&(in_RCX->d).d = pQVar7->val;
        }
        else {
          pQVar7 = qMin<QFixed>((QFixed *)this_00,
                                (QFixed *)CONCAT44(PVar3,in_stack_ffffffffffffff78));
          *in_R8 = pQVar7->val;
        }
      }
    }
    local_64 = local_64 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::floatMargins(QFixed y, const QTextLayoutStruct *layoutStruct,
                                              QFixed *left, QFixed *right) const
{
//     qDebug() << "floatMargins y=" << y;
    *left = layoutStruct->x_left;
    *right = layoutStruct->x_right;
    QTextFrameData *lfd = data(layoutStruct->frame);
    for (int i = 0; i < lfd->floats.size(); ++i) {
        QTextFrameData *fd = data(lfd->floats.at(i));
        if (!fd->layoutDirty) {
            if (fd->position.y <= y && fd->position.y + fd->size.height > y) {
//                 qDebug() << "adjusting with float" << f << fd->position.x()<< fd->size.width();
                if (lfd->floats.at(i)->frameFormat().position() == QTextFrameFormat::FloatLeft)
                    *left = qMax(*left, fd->position.x + fd->size.width);
                else
                    *right = qMin(*right, fd->position.x);
            }
        }
    }
//     qDebug() << "floatMargins: left="<<*left<<"right="<<*right<<"y="<<y;
}